

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O0

int callBackInstallAutoCompletion(int index,char **buff)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  string local_3e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380 [32];
  string local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  string local_320 [32];
  string local_300 [8];
  fstream fileWirter;
  ostream local_2f0 [512];
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [8];
  string script;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [8];
  string location;
  int i;
  allocator local_39;
  string local_38 [8];
  string programName;
  char **buff_local;
  int index_local;
  
  pcVar1 = *buff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  poVar4 = std::operator<<((ostream *)&std::cout,"generate auto completion");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  while( true ) {
    iVar3 = std::__cxx11::string::find((char *)local_38,0x1164df);
    if (iVar3 == -1) break;
    std::__cxx11::string::erase((ulong)local_38,0);
  }
  std::operator+(local_70,(char *)local_38);
  std::operator+(local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          autoCompletionScript_abi_cxx11_);
  std::operator+(local_90,(char *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::operator+((char *)local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "complete -F _function ./");
  std::operator+(local_d0,(char *)local_f0);
  std::__cxx11::string::operator+=((string *)local_90,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string(local_f0);
  std::fstream::fstream(local_300);
  std::operator|(_S_out,_S_trunc);
  std::fstream::open(local_300,(_Ios_Openmode)local_70);
  bVar2 = std::fstream::is_open();
  if ((bVar2 & 1) == 0) {
    std::operator+((char *)local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "failed to open ");
    poVar4 = std::operator<<((ostream *)&std::cout,local_320);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_320);
    std::fstream::~fstream(local_300);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_38);
    return index;
  }
  std::operator<<(local_2f0,(string *)local_90);
  std::fstream::close();
  std::operator+((char *)local_360,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "try it out with: \n\t \"source ");
  std::operator+(local_340,(char *)local_360);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_340);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string(local_360);
  std::operator+((char *)local_3e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "to persist the atuo completion by copying the .bash file to /etc/bash_completion.d/ with:  \n\t \"cp "
                );
  std::operator+(local_3c0,(char *)local_3e0);
  std::operator+(local_3a0,local_3c0);
  std::operator+(local_380,(char *)local_3a0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_380);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_380);
  std::__cxx11::string::~string((string *)local_3a0);
  std::__cxx11::string::~string((string *)local_3c0);
  std::__cxx11::string::~string(local_3e0);
  exit(0);
}

Assistant:

int callBackInstallAutoCompletion(int index, char **buff) {
#ifdef __linux__
    string programName = string(buff[0]);
    cout << "generate auto completion" << endl;
    int i = 0;
    // extract Binary name
    while ((i = programName.find("/")) != string::npos) {
        programName.erase(0, i + 1);
    }
    string location = programName + ".bash";
    string script = autoCompletionScript + programName + " \n";
    script += "complete -F _function ./" + programName + " \n";
    fstream fileWirter;
    fileWirter.open(location, fstream::out | ios::trunc);
    if (!fileWirter.is_open()) {
        cout << "failed to open " + location << endl;
        return index;
    }
    fileWirter << script;
    fileWirter.close();

    cout << "try it out with: \n\t \"source " + programName + ".bash\"" << endl;
    cout << "to persist the atuo completion by copying the .bash file to /etc/bash_completion.d/ with:  \n\t \"cp "
            "" + programName + ".bash  /etc/bash_completion.d/" + programName + ".bash\" " << endl;

    exit(0);
#elif __WIN32
    cout << "Auto completion not (jet) suportet under Windows"<<endl;
#endif
    return index;
}